

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iarchive_boost_suite.cpp
# Opt level: O2

void optional_suite::test_value(void)

{
  reference_type pbVar1;
  value_type input [3];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> value;
  iarchive in;
  
  input[2] = 'A';
  input[0] = 0xa9;
  input[1] = '\x01';
  trial::protocol::bintoken::iarchive::iarchive<unsigned_char[3]>(&in,&input);
  value.super_type.m_initialized = false;
  trial::protocol::bintoken::iarchive::load_override<boost::optional<std::__cxx11::string>>
            (&in,&value);
  boost::detail::test_impl
            ("value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_boost_suite.cpp"
             ,0x20,"void optional_suite::test_value()",value.super_type.m_initialized);
  pbVar1 = boost::
           optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::get(&value);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[2]>
            ("*value","\"A\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_boost_suite.cpp"
             ,0x21,"void optional_suite::test_value()",pbVar1,"A");
  boost::optional_detail::
  optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional_base(&value.super_type);
  trial::protocol::bintoken::iarchive::~iarchive(&in);
  return;
}

Assistant:

void test_value()
{
    const value_type input[] = { token::code::string8, 0x01, 'A' };
    format::iarchive in(input);
    boost::optional<std::string> value;
    TRIAL_PROTOCOL_TEST_NO_THROW(in >> value);
    TRIAL_PROTOCOL_TEST(value);
    TRIAL_PROTOCOL_TEST_EQUAL(*value, "A");
}